

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseMinMax(FScanner *sc,FName *identifier,PClassActor *cls)

{
  bool bVar1;
  FxMinMax *this;
  FScriptPosition local_58;
  FName local_48 [4];
  FxExpression *local_38;
  FxExpression *expr;
  TArray<FxExpression_*,_FxExpression_*> list;
  PClassActor *cls_local;
  FName *identifier_local;
  FScanner *sc_local;
  
  list._8_8_ = cls;
  TArray<FxExpression_*,_FxExpression_*>::TArray((TArray<FxExpression_*,_FxExpression_*> *)&expr);
  while( true ) {
    local_38 = ParseExpressionM(sc,(PClassActor *)list._8_8_);
    TArray<FxExpression_*,_FxExpression_*>::Push
              ((TArray<FxExpression_*,_FxExpression_*> *)&expr,&local_38);
    bVar1 = FScanner::CheckToken(sc,0x29);
    if (bVar1) break;
    FScanner::MustGetToken(sc,0x2c);
  }
  this = (FxMinMax *)operator_new(0x50);
  FName::FName(local_48,identifier);
  FScriptPosition::FScriptPosition(&local_58,sc);
  FxMinMax::FxMinMax(this,(TArray<FxExpression_*,_FxExpression_*> *)&expr,local_48,&local_58);
  FScriptPosition::~FScriptPosition(&local_58);
  TArray<FxExpression_*,_FxExpression_*>::~TArray((TArray<FxExpression_*,_FxExpression_*> *)&expr);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseMinMax(FScanner &sc, FName identifier, PClassActor *cls)
{
	TArray<FxExpression*> list;
	for (;;)
	{
		FxExpression *expr = ParseExpressionM(sc, cls);
		list.Push(expr);
		if (sc.CheckToken(')'))
			break;
		sc.MustGetToken(',');
	}
	return new FxMinMax(list, identifier, sc);
}